

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_insert_nextto(lyd_node *sibling,lyd_node *node,int before,int invalidate)

{
  lyd_node *plVar1;
  lyd_node *plVar2;
  lys_node *plVar3;
  long lVar4;
  int iVar5;
  LY_ERR *pLVar6;
  char *pcVar7;
  bool bVar8;
  char *str;
  lyd_node *plStack_80;
  int invalid;
  lyd_node *orig_next;
  lyd_node *orig_prev;
  lyd_node *orig_parent;
  lyd_node *last;
  lyd_node *next2;
  lyd_node *next1;
  lyd_node *ins;
  lyd_node *start;
  lyd_node *iter;
  lys_node *par2;
  lys_node *par1;
  int invalidate_local;
  int before_local;
  lyd_node *node_local;
  lyd_node *sibling_local;
  
  ins = (lyd_node *)0x0;
  orig_prev = (lyd_node *)0x0;
  orig_next = (lyd_node *)0x0;
  plStack_80 = (lyd_node *)0x0;
  str._4_4_ = 0;
  par1._0_4_ = invalidate;
  par1._4_4_ = before;
  _invalidate_local = node;
  node_local = sibling;
  if (sibling == (lyd_node *)0x0) {
    __assert_fail("sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xe9e,"int lyd_insert_nextto(struct lyd_node *, struct lyd_node *, int, int)");
  }
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xe9f,"int lyd_insert_nextto(struct lyd_node *, struct lyd_node *, int, int)");
  }
  if (sibling == node) {
    sibling_local._4_4_ = 0;
  }
  else {
    par2 = lys_parent(sibling->schema);
    while( true ) {
      bVar8 = false;
      if (par2 != (lys_node *)0x0) {
        bVar8 = (par2->nodetype & (LYS_ACTION|LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)
                ) == LYS_UNKNOWN;
      }
      if (!bVar8) break;
      par2 = lys_parent(par2);
    }
    iter = (lyd_node *)lys_parent(_invalidate_local->schema);
    while( true ) {
      bVar8 = false;
      if (iter != (lyd_node *)0x0) {
        bVar8 = ((ulong)iter[1].schema & 0x4691) == 0;
      }
      if (!bVar8) break;
      iter = (lyd_node *)lys_parent((lys_node *)iter);
    }
    if (par2 == (lys_node *)iter) {
      if (((int)par1 != 0) &&
         (((_invalidate_local->parent != node_local->parent ||
           (str._4_4_ = lyp_is_rpc_action(_invalidate_local->schema), str._4_4_ != 0)) ||
          (_invalidate_local->parent == (lyd_node *)0x0)))) {
        if ((_invalidate_local->parent == (lyd_node *)0x0) && (str._4_4_ == 0)) {
          for (start = _invalidate_local->prev;
              (start != _invalidate_local && (start != node_local)); start = start->prev) {
          }
          if (start == _invalidate_local) {
            str._4_4_ = 1;
          }
        }
        else {
          str._4_4_ = str._4_4_ + 1;
        }
      }
      if ((_invalidate_local->parent != (lyd_node *)0x0) ||
         (_invalidate_local->prev->next != (lyd_node *)0x0)) {
        orig_prev = _invalidate_local->parent;
        if (_invalidate_local->prev != _invalidate_local) {
          orig_next = _invalidate_local->prev;
        }
        plStack_80 = _invalidate_local->next;
        lyd_unlink_internal(_invalidate_local,str._4_4_);
      }
      if (node_local->parent == (lyd_node *)0x0) {
        ins = node_local;
        while (ins->prev->next != (lyd_node *)0x0) {
          ins = ins->prev;
        }
      }
      else {
        ins = node_local->parent->child;
      }
      next1 = _invalidate_local;
      plVar1 = next1;
LAB_0018d8f7:
      next1 = plVar1;
      if (next1 != (lyd_node *)0x0) {
        plVar1 = next1->next;
        next1->parent = node_local->parent;
        orig_parent = next1;
        if (str._4_4_ != 0) {
          lyd_insert_setinvalid(next1);
        }
        if ((str._4_4_ == 1) &&
           (iVar5 = lyv_multicases(next1,(lys_node *)0x0,&ins,1,node_local), plVar2 = node_local,
           iVar5 == 2)) {
          pcVar7 = ly_errpath();
          ly_vlog(LYE_SPEC,LY_VLOG_LYD,plVar2,
                  "Insert request refers node (%s) that is going to be auto-deleted.",pcVar7);
LAB_0018dd40:
          if (orig_next == (lyd_node *)0x0) {
            if (plStack_80 == (lyd_node *)0x0) {
              if (orig_prev != (lyd_node *)0x0) {
                orig_prev->child = _invalidate_local;
                _invalidate_local->parent = orig_prev;
              }
            }
            else {
              lyd_insert_before(plStack_80,_invalidate_local);
            }
          }
          else {
            lyd_insert_after(orig_next,_invalidate_local);
          }
          return 1;
        }
        if (next1->schema->nodetype == LYS_LEAFLIST) {
          start = ins;
          plVar2 = start;
          while (start = plVar2, start != (lyd_node *)0x0) {
            plVar2 = start->next;
            if ((start->schema == next1->schema) &&
               ((((next1->field_0x9 & 1) != 0 &&
                 (((start->field_0x9 & 1) == 0 ||
                  (((start->schema->flags & 1) != 0 &&
                   (iVar5 = strcmp((char *)start->child,(char *)next1->child), iVar5 == 0)))))) ||
                (((next1->field_0x9 & 1) == 0 && ((start->field_0x9 & 1) != 0)))))) {
              if (start == node_local) {
                pLVar6 = ly_errno_location();
                *pLVar6 = LY_EINVAL;
                pLVar6 = ly_errno_location();
                *pLVar6 = LY_EINVAL;
                pcVar7 = lyd_path(node_local);
                ly_log(LY_LLERR,"Insert request refers node (%s) that is going to be auto-deleted.")
                ;
                free(pcVar7);
                goto LAB_0018dd40;
              }
              if (start == ins) {
                ins = plVar2;
              }
              lyd_free(start);
            }
          }
        }
        else if ((next1->schema->nodetype == LYS_LEAF) ||
                ((next1->schema->nodetype == LYS_CONTAINER &&
                 (plVar3 = next1->schema, lVar4._0_2_ = plVar3[1].flags,
                 lVar4._2_1_ = plVar3[1].ext_size, lVar4._3_1_ = plVar3[1].iffeature_size,
                 lVar4._4_1_ = plVar3[1].padding[0], lVar4._5_1_ = plVar3[1].padding[1],
                 lVar4._6_1_ = plVar3[1].padding[2], lVar4._7_1_ = plVar3[1].padding[3], lVar4 == 0)
                 ))) {
          for (start = ins; start != (lyd_node *)0x0; start = start->next) {
            if (start->schema == next1->schema) {
              if (((start->field_0x9 & 1) != 0) || ((next1->field_0x9 & 1) != 0)) {
                if (start == node_local) {
                  pLVar6 = ly_errno_location();
                  *pLVar6 = LY_EINVAL;
                  pLVar6 = ly_errno_location();
                  *pLVar6 = LY_EINVAL;
                  pcVar7 = lyd_path(node_local);
                  ly_log(LY_LLERR,
                         "Insert request refers node (%s) that is going to be auto-deleted.");
                  free(pcVar7);
                  goto LAB_0018dd40;
                }
                if (start == ins) {
                  ins = start->next;
                }
                lyd_free(start);
              }
              break;
            }
          }
        }
        goto LAB_0018d8f7;
      }
      if (par1._4_4_ == 0) {
        if (node_local->next == (lyd_node *)0x0) {
          ins->prev = orig_parent;
        }
        else {
          orig_parent->next = node_local->next;
          node_local->next->prev = orig_parent;
        }
        node_local->next = _invalidate_local;
        _invalidate_local->prev = node_local;
      }
      else {
        if (node_local->prev->next == (lyd_node *)0x0) {
          if (node_local->parent != (lyd_node *)0x0) {
            node_local->parent->child = _invalidate_local;
          }
        }
        else {
          node_local->prev->next = _invalidate_local;
        }
        _invalidate_local->prev = node_local->prev;
        node_local->prev = orig_parent;
        orig_parent->next = node_local;
      }
      if ((int)par1 != 0) {
        for (next2 = _invalidate_local;
            (next2 != (lyd_node *)0x0 && (check_leaf_list_backlinks(next2,0), next2 != orig_parent))
            ; next2 = next2->next) {
        }
      }
      sibling_local._4_4_ = 0;
    }
    else {
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EINVAL;
      sibling_local._4_4_ = 1;
    }
  }
  return sibling_local._4_4_;
}

Assistant:

int
lyd_insert_nextto(struct lyd_node *sibling, struct lyd_node *node, int before, int invalidate)
{
    struct lys_node *par1, *par2;
    struct lyd_node *iter, *start = NULL, *ins, *next1, *next2, *last;
    struct lyd_node *orig_parent = NULL, *orig_prev = NULL, *orig_next = NULL;
    int invalid = 0;
    char *str;

    assert(sibling);
    assert(node);

    if (sibling == node) {
        return EXIT_SUCCESS;
    }

    /* check placing the node to the appropriate place according to the schema */
    for (par1 = lys_parent(sibling->schema);
         par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_ACTION | LYS_NOTIF));
         par1 = lys_parent(par1));
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_ACTION | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    if (invalidate && ((node->parent != sibling->parent) || (invalid = lyp_is_rpc_action(node->schema)) || !node->parent)) {
        /* a) it is not just moving under a parent node (invalid = 1) or
         * b) it is in an RPC where nodes order matters (invalid = 2) or
         * c) it is top-level where we don't know if it is the same tree (invalid = 1),
         * so the validation will be necessary */
        if (!node->parent && !invalid) {
            /* c) search in siblings */
            for (iter = node->prev; iter != node; iter = iter->prev) {
                if (iter == sibling) {
                    break;
                }
            }
            if (iter == node) {
                /* node and siblings are not currently in the same data tree */
                invalid++;
            }
        } else { /* a) and b) */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* remember the original position to be able to revert
         * unlink in case of error */
        orig_parent = node->parent;
        if (node->prev != node) {
            orig_prev = node->prev;
        }
        orig_next = node->next;
        lyd_unlink_internal(node, invalid);
    }

    /* find first sibling node */
    if (sibling->parent) {
        start = sibling->parent->child;
    } else {
        for (start = sibling; start->prev->next; start = start->prev);
    }

    /* process the nodes one by one to clean the current tree */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        ins->parent = sibling->parent;
        last = ins;

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }

        if (invalid == 1) {
            /* auto delete nodes from other cases */
            if (lyv_multicases(ins, NULL, &start, 1, sibling) == 2) {
                LOGVAL(LYE_SPEC, LY_VLOG_LYD, sibling, "Insert request refers node (%s) that is going to be auto-deleted.",
                       ly_errpath());
                goto error;
            }
        }

        /* try to find previously present default instance to remove because of
         * inserting the specified node */
        if (ins->schema->nodetype == LYS_LEAFLIST) {
            LY_TREE_FOR_SAFE(start, next2, iter) {
                if (iter->schema == ins->schema) {
                    if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                       !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                              ((struct lyd_node_leaf_list *)ins)->value_str))))
                            || (!ins->dflt && iter->dflt)) {
                        /* iter will get deleted */
                        if (iter == sibling) {
                            ly_errno = LY_EINVAL;
                            str = NULL;
                            LOGERR(LY_EINVAL, "Insert request refers node (%s) that is going to be auto-deleted.",
                                str = lyd_path(sibling));
                            free(str);
                            goto error;
                        }
                        if (iter == start) {
                            start = next2;
                        }
                        lyd_free(iter);
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF ||
                (ins->schema->nodetype == LYS_CONTAINER && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (iter->dflt || ins->dflt) {
                        /* iter gets deleted */
                        if (iter == sibling) {
                            ly_errno = LY_EINVAL;
                            str = NULL;
                            LOGERR(LY_EINVAL, "Insert request refers node (%s) that is going to be auto-deleted.",
                                str = lyd_path(sibling));
                            free(str);
                            goto error;
                        }
                        if (iter == start) {
                            start = iter->next;
                        }
                        lyd_free(iter);
                    }
                    break;
                }
            }
        }
    }

    /* insert the (list of) node(s) to the specified position */
    if (before) {
        if (sibling->prev->next) {
            /* adding into a middle */
            sibling->prev->next = node;
        } else if (sibling->parent) {
            /* at the beginning */
            sibling->parent->child = node;
        }
        node->prev = sibling->prev;
        sibling->prev = last;
        last->next = sibling;
    } else { /* after */
        if (sibling->next) {
            /* adding into a middle - fix the prev pointer of the node after inserted nodes */
            last->next = sibling->next;
            sibling->next->prev = last;
        } else {
            /* at the end - fix the prev pointer of the first node */
            start->prev = last;
        }
        sibling->next = node;
        node->prev = sibling;
    }

    if (invalidate) {
        LY_TREE_FOR(node, next1) {
            check_leaf_list_backlinks(next1, 0);
            if (next1 == last) {
                break;
            }
        }
    }


    return EXIT_SUCCESS;

error:
    /* insert back to the original position */
    if (orig_prev) {
        lyd_insert_after(orig_prev, node);
    } else if (orig_next) {
        lyd_insert_before(orig_next, node);
    } else if (orig_parent) {
        /* there were no siblings */
        orig_parent->child = node;
        node->parent = orig_parent;
    }
    return EXIT_FAILURE;
}